

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_dupset(SessionHandle *dst,SessionHandle *src)

{
  bool bVar1;
  CURLcode CVar2;
  char *pcVar3;
  long lVar4;
  char **__s;
  
  memcpy(&dst->set,&src->set,0x500);
  __s = (dst->set).str;
  lVar4 = 0;
  memset(__s,0,0x140);
  while( true ) {
    pcVar3 = (src->set).str[lVar4];
    if (__s[lVar4] != (char *)0x0) {
      (*Curl_cfree)(__s[lVar4]);
      __s[lVar4] = (char *)0x0;
    }
    bVar1 = true;
    if (pcVar3 == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      CVar2 = CURLE_OK;
      if (pcVar3 == (char *)0x0) {
        CVar2 = CURLE_OUT_OF_MEMORY;
        bVar1 = false;
      }
      else {
        __s[lVar4] = pcVar3;
      }
    }
    if (!bVar1) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x28) {
      return CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_dupset(struct SessionHandle *dst, struct SessionHandle *src)
{
  CURLcode r = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LAST; i++) {
    r = setstropt(&dst->set.str[i], src->set.str[i]);
    if(r != CURLE_OK)
      break;
  }

  /* If a failure occurred, freeing has to be performed externally. */
  return r;
}